

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafe::PushAsyncRequest
          (CommissionerSafe *this,AsyncRequest *aAsyncRequest)

{
  mutex *__mutex;
  undefined8 uVar1;
  int iVar2;
  
  __mutex = &this->mInvokeMutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
               &this->mAsyncRequestQueue,aAsyncRequest);
    event_active(&this->mInvokeEvent,0,0);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar1 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar1);
}

Assistant:

void CommissionerSafe::PushAsyncRequest(AsyncRequest &&aAsyncRequest)
{
    std::lock_guard<std::mutex> _(mInvokeMutex);

    mAsyncRequestQueue.emplace(std::move(aAsyncRequest));

    // Notify for new async request
    event_active(&mInvokeEvent, 0, 0);
}